

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_decode_version4_Test::
~LoginMessageTest_test_decode_version4_Test(LoginMessageTest_test_decode_version4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LoginMessageTest, test_decode_version4)
{
    ByteBuffer buffer = BufferUtil::StringAsBuffer(ENCODED_MESSAGE_V4);
    LoginMessage decoded = Decode(buffer, PixieVersion::VERSION4);
    EXPECT_EQ(USERNAME, decoded.GetUsername());
    EXPECT_EQ(PASSWORD, decoded.GetPassword());
    EXPECT_EQ(ALIAS, decoded.GetAlias());
    EXPECT_EQ(APPLICATION, decoded.GetApplication());
    EXPECT_EQ(APPLICATION_VERSION, decoded.GetApplicationVersion());
    EXPECT_EQ(API, decoded.GetApi());
    EXPECT_EQ(API_VERSION, decoded.GetApiVersion());
    EXPECT_EQ("BidFXCpp", decoded.GetProduct());
    EXPECT_EQ(PRODUCT_SERIAL_NUMBER, decoded.GetProductSerialNumber());
}